

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.h
# Opt level: O2

void __thiscall
yyml::nn::NN::SetLayer<yyml::nn::DenseLayer,yyml::TensorShape,yyml::TensorShape>
          (NN *this,string_view name,TensorShape *params,TensorShape *params_1)

{
  DenseLayer *pDVar1;
  DenseLayer *new_layer;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  DenseLayer *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = name._M_str;
  local_28._M_len = name._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_28,&local_51);
  pDVar1 = Factory<yyml::nn::DenseLayer>::
           GetNewInstance<yyml::TensorShape,yyml::TensorShape,std::__cxx11::string>
                     (params,params_1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = pDVar1;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_50,&local_28,&local_51);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>,std::allocator<std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string,yyml::nn::DenseLayer*&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>,std::allocator<std::pair<std::__cxx11::string_const,yyml::nn::LayerInterface*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->layers_,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SetLayer(std::string_view name, Params... params) {
    auto* new_layer = LayerType::factory::GetNewInstance(
        std::forward<Params>(params)..., std::string(name));
    layers_.emplace(std::string(name), new_layer);
  }